

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ComesFromThisTransmitter(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  uint16_t uVar8;
  AddressType AVar9;
  reference piVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  in6_addr iVar25;
  bool local_89;
  uint8_t uStack_80;
  uint8_t uStack_7f;
  uint8_t uStack_7e;
  uint8_t uStack_7d;
  uint8_t uStack_7c;
  uint8_t uStack_7b;
  uint8_t uStack_7a;
  uint8_t uStack_79;
  in6_addr addrip;
  in6_addr itip;
  _List_const_iterator<in6_addr> local_58;
  iterator local_50;
  _List_const_iterator<in6_addr> local_48;
  _List_const_iterator<in6_addr> local_40;
  const_iterator it;
  bool found;
  RTPIPv6Address *addr2;
  bool v;
  RTPAddress *addr_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (((this->created & 1U) == 0) ||
       (AVar9 = RTPAddress::GetAddressType(addr), AVar9 != IPv6Address)) {
      addr2._7_1_ = false;
    }
    else {
      it._M_node._7_1_ = 0;
      std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_40);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::begin(&this->localIPs);
      std::_List_const_iterator<in6_addr>::_List_const_iterator(&local_48,&local_50);
      local_40._M_node = local_48._M_node;
      while( true ) {
        local_89 = false;
        if ((it._M_node._7_1_ & 1) == 0) {
          itip.__in6_u._8_8_ =
               std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::end(&this->localIPs);
          std::_List_const_iterator<in6_addr>::_List_const_iterator
                    (&local_58,(iterator *)((long)&itip.__in6_u + 8));
          local_89 = std::operator!=(&local_40,&local_58);
        }
        if (local_89 == false) break;
        piVar10 = std::_List_const_iterator<in6_addr>::operator*(&local_40);
        uVar1 = *(undefined8 *)&piVar10->__in6_u;
        itip.__in6_u._0_8_ = *(undefined8 *)((long)&piVar10->__in6_u + 8);
        iVar25 = RTPIPv6Address::GetIP((RTPIPv6Address *)addr);
        addrip.__in6_u.__u6_addr8[8] = (uint8_t)uVar1;
        addrip.__in6_u.__u6_addr8[9] = (uint8_t)((ulong)uVar1 >> 8);
        addrip.__in6_u.__u6_addr8[10] = (uint8_t)((ulong)uVar1 >> 0x10);
        addrip.__in6_u.__u6_addr8[0xb] = (uint8_t)((ulong)uVar1 >> 0x18);
        addrip.__in6_u.__u6_addr8[0xc] = (uint8_t)((ulong)uVar1 >> 0x20);
        addrip.__in6_u.__u6_addr8[0xd] = (uint8_t)((ulong)uVar1 >> 0x28);
        addrip.__in6_u.__u6_addr8[0xe] = (uint8_t)((ulong)uVar1 >> 0x30);
        addrip.__in6_u.__u6_addr8[0xf] = (uint8_t)((ulong)uVar1 >> 0x38);
        uStack_80 = iVar25.__in6_u._0_1_;
        uStack_7f = iVar25.__in6_u._1_1_;
        uStack_7e = iVar25.__in6_u._2_1_;
        uStack_7d = iVar25.__in6_u._3_1_;
        uStack_7c = iVar25.__in6_u._4_1_;
        uStack_7b = iVar25.__in6_u._5_1_;
        uStack_7a = iVar25.__in6_u._6_1_;
        uStack_79 = iVar25.__in6_u._7_1_;
        addrip.__in6_u.__u6_addr8[0] = iVar25.__in6_u._8_1_;
        addrip.__in6_u.__u6_addr8[1] = iVar25.__in6_u._9_1_;
        addrip.__in6_u.__u6_addr8[2] = iVar25.__in6_u._10_1_;
        addrip.__in6_u.__u6_addr8[3] = iVar25.__in6_u._11_1_;
        addrip.__in6_u.__u6_addr8[4] = iVar25.__in6_u._12_1_;
        addrip.__in6_u.__u6_addr8[5] = iVar25.__in6_u._13_1_;
        addrip.__in6_u.__u6_addr8[6] = iVar25.__in6_u._14_1_;
        addrip.__in6_u.__u6_addr8[7] = iVar25.__in6_u._15_1_;
        cVar11 = -(uStack_7e == addrip.__in6_u.__u6_addr8[10]);
        cVar12 = -(uStack_7d == addrip.__in6_u.__u6_addr8[0xb]);
        cVar13 = -(uStack_7c == addrip.__in6_u.__u6_addr8[0xc]);
        cVar14 = -(uStack_7b == addrip.__in6_u.__u6_addr8[0xd]);
        cVar15 = -(uStack_7a == addrip.__in6_u.__u6_addr8[0xe]);
        cVar16 = -(uStack_79 == addrip.__in6_u.__u6_addr8[0xf]);
        cVar17 = -(addrip.__in6_u.__u6_addr8[0] == itip.__in6_u.__u6_addr8[0]);
        cVar18 = -(addrip.__in6_u.__u6_addr8[1] == itip.__in6_u.__u6_addr8[1]);
        cVar19 = -(addrip.__in6_u.__u6_addr8[2] == itip.__in6_u.__u6_addr8[2]);
        cVar20 = -(addrip.__in6_u.__u6_addr8[3] == itip.__in6_u.__u6_addr8[3]);
        cVar21 = -(addrip.__in6_u.__u6_addr8[4] == itip.__in6_u.__u6_addr8[4]);
        cVar22 = -(addrip.__in6_u.__u6_addr8[5] == itip.__in6_u.__u6_addr8[5]);
        cVar23 = -(addrip.__in6_u.__u6_addr8[6] == itip.__in6_u.__u6_addr8[6]);
        bVar24 = -(addrip.__in6_u.__u6_addr8[7] == itip.__in6_u.__u6_addr8[7]);
        auVar2[1] = -(uStack_7f == addrip.__in6_u.__u6_addr8[9]);
        auVar2[0] = -(uStack_80 == addrip.__in6_u.__u6_addr8[8]);
        auVar2[2] = cVar11;
        auVar2[3] = cVar12;
        auVar2[4] = cVar13;
        auVar2[5] = cVar14;
        auVar2[6] = cVar15;
        auVar2[7] = cVar16;
        auVar2[8] = cVar17;
        auVar2[9] = cVar18;
        auVar2[10] = cVar19;
        auVar2[0xb] = cVar20;
        auVar2[0xc] = cVar21;
        auVar2[0xd] = cVar22;
        auVar2[0xe] = cVar23;
        auVar2[0xf] = bVar24;
        auVar3[1] = -(uStack_7f == addrip.__in6_u.__u6_addr8[9]);
        auVar3[0] = -(uStack_80 == addrip.__in6_u.__u6_addr8[8]);
        auVar3[2] = cVar11;
        auVar3[3] = cVar12;
        auVar3[4] = cVar13;
        auVar3[5] = cVar14;
        auVar3[6] = cVar15;
        auVar3[7] = cVar16;
        auVar3[8] = cVar17;
        auVar3[9] = cVar18;
        auVar3[10] = cVar19;
        auVar3[0xb] = cVar20;
        auVar3[0xc] = cVar21;
        auVar3[0xd] = cVar22;
        auVar3[0xe] = cVar23;
        auVar3[0xf] = bVar24;
        auVar7[1] = cVar12;
        auVar7[0] = cVar11;
        auVar7[2] = cVar13;
        auVar7[3] = cVar14;
        auVar7[4] = cVar15;
        auVar7[5] = cVar16;
        auVar7[6] = cVar17;
        auVar7[7] = cVar18;
        auVar7[8] = cVar19;
        auVar7[9] = cVar20;
        auVar7[10] = cVar21;
        auVar7[0xb] = cVar22;
        auVar7[0xc] = cVar23;
        auVar7[0xd] = bVar24;
        auVar6[1] = cVar13;
        auVar6[0] = cVar12;
        auVar6[2] = cVar14;
        auVar6[3] = cVar15;
        auVar6[4] = cVar16;
        auVar6[5] = cVar17;
        auVar6[6] = cVar18;
        auVar6[7] = cVar19;
        auVar6[8] = cVar20;
        auVar6[9] = cVar21;
        auVar6[10] = cVar22;
        auVar6[0xb] = cVar23;
        auVar6[0xc] = bVar24;
        auVar5[1] = cVar14;
        auVar5[0] = cVar13;
        auVar5[2] = cVar15;
        auVar5[3] = cVar16;
        auVar5[4] = cVar17;
        auVar5[5] = cVar18;
        auVar5[6] = cVar19;
        auVar5[7] = cVar20;
        auVar5[8] = cVar21;
        auVar5[9] = cVar22;
        auVar5[10] = cVar23;
        auVar5[0xb] = bVar24;
        auVar4[1] = cVar15;
        auVar4[0] = cVar14;
        auVar4[2] = cVar16;
        auVar4[3] = cVar17;
        auVar4[4] = cVar18;
        auVar4[5] = cVar19;
        auVar4[6] = cVar20;
        auVar4[7] = cVar21;
        auVar4[8] = cVar22;
        auVar4[9] = cVar23;
        auVar4[10] = bVar24;
        if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21
                                                  ,CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21
                                                  ,CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
          it._M_node._7_1_ = 1;
        }
        else {
          std::_List_const_iterator<in6_addr>::operator++(&local_40);
        }
      }
      if ((it._M_node._7_1_ & 1) == 0) {
        addr2._7_1_ = false;
      }
      else {
        uVar8 = RTPIPv6Address::GetPort((RTPIPv6Address *)addr);
        if (uVar8 == this->portbase) {
          addr2._7_1_ = true;
        }
        else {
          uVar8 = RTPIPv6Address::GetPort((RTPIPv6Address *)addr);
          addr2._7_1_ = (uint)uVar8 == this->portbase + 1;
        }
      }
    }
    this_local._7_1_ = addr2._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv6Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv6Address)
	{	
		const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
		bool found = false;
		std::list<in6_addr>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			in6_addr itip = *it;
			in6_addr addrip = addr2->GetIP();
			if (memcmp(&addrip,&itip,sizeof(in6_addr)) == 0)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == portbase) // check for RTP port
				v = true;
			else if (addr2->GetPort() == (portbase+1)) // check for RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}